

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O0

bool boost::system::operator==(error_code *code,error_condition *condition)

{
  byte bVar1;
  int iVar2;
  error_category *peVar3;
  undefined1 local_19;
  error_condition *condition_local;
  error_code *code_local;
  
  peVar3 = error_code::category(code);
  iVar2 = error_code::value(code);
  bVar1 = (**(code **)(*(long *)peVar3 + 0x28))(peVar3,iVar2,condition);
  local_19 = 1;
  if ((bVar1 & 1) == 0) {
    peVar3 = error_condition::category(condition);
    iVar2 = error_condition::value(condition);
    local_19 = (**(code **)(*(long *)peVar3 + 0x30))(peVar3,code,iVar2);
  }
  return (bool)(local_19 & 1);
}

Assistant:

inline bool operator==( const error_code & code,
                            const error_condition & condition ) BOOST_SYSTEM_NOEXCEPT
    {
      return code.category().equivalent( code.value(), condition )
        || condition.category().equivalent( code, condition.value() );
    }